

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PNGImageHandler.cpp
# Opt level: O3

PDFFormXObject *
CreateImageFormXObjectFromImageXObject
          (PDFImageXObjectList *inImageXObject,ObjectIDType inFormXObjectID,
          png_uint_32 transformed_width,png_uint_32 transformed_height,
          DocumentContext *inDocumentContext)

{
  EStatusCode EVar1;
  PDFFormXObject *this;
  XObjectContentContext *this_00;
  ResourcesDictionary *this_01;
  Trace *pTVar2;
  _List_node_base *p_Var3;
  undefined1 local_68 [32];
  DocumentContext *local_48;
  double local_40;
  double local_38;
  
  local_38 = (double)transformed_width;
  local_40 = (double)transformed_height;
  PDFRectangle::PDFRectangle((PDFRectangle *)local_68,0.0,0.0,local_38,local_40);
  this = PDFHummus::DocumentContext::StartFormXObject
                   (inDocumentContext,(PDFRectangle *)local_68,inFormXObjectID,(double *)0x0,false);
  PDFRectangle::~PDFRectangle((PDFRectangle *)local_68);
  if (this == (PDFFormXObject *)0x0) {
    pTVar2 = Trace::DefaultTrace();
    this = (PDFFormXObject *)0x0;
    Trace::TraceToLog(pTVar2,
                      "PNGImageHandler::CreateImageFormXObjectFromImageXObject. Unexpected Error, could not start form XObject for image"
                     );
  }
  else {
    local_48 = inDocumentContext;
    this_00 = PDFFormXObject::GetContentContext(this);
    p_Var3 = (inImageXObject->
             super__List_base<PDFImageXObject_*,_std::allocator<PDFImageXObject_*>_>)._M_impl.
             _M_node.super__List_node_base._M_next;
    if (p_Var3 != (_List_node_base *)inImageXObject) {
      do {
        AbstractContentContext::q(&this_00->super_AbstractContentContext);
        AbstractContentContext::cm
                  (&this_00->super_AbstractContentContext,local_38,0.0,0.0,local_40,0.0,0.0);
        this_01 = PDFFormXObject::GetResourcesDictionary(this);
        ResourcesDictionary::AddImageXObjectMapping_abi_cxx11_
                  ((string *)local_68,this_01,(PDFImageXObject *)p_Var3[1]._M_next);
        AbstractContentContext::Do(&this_00->super_AbstractContentContext,(string *)local_68);
        if ((undefined1 *)local_68._0_8_ != local_68 + 0x10) {
          operator_delete((void *)local_68._0_8_,local_68._16_8_ + 1);
        }
        AbstractContentContext::Q(&this_00->super_AbstractContentContext);
        p_Var3 = (((_List_base<PDFImageXObject_*,_std::allocator<PDFImageXObject_*>_> *)
                  &p_Var3->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
      } while (p_Var3 != (_List_node_base *)inImageXObject);
    }
    EVar1 = PDFHummus::DocumentContext::EndFormXObjectNoRelease(local_48,this);
    if (EVar1 != eSuccess) {
      pTVar2 = Trace::DefaultTrace();
      Trace::TraceToLog(pTVar2,
                        "PNGImageHandler::CreateImageFormXObjectFromImageXObject. Unexpected Error, could not create form XObject for image"
                       );
      PDFFormXObject::~PDFFormXObject(this);
      operator_delete(this,0x1f0);
      this = (PDFFormXObject *)0x0;
    }
  }
  return this;
}

Assistant:

PDFFormXObject* CreateImageFormXObjectFromImageXObject(
	const PDFImageXObjectList& inImageXObject, 
	ObjectIDType inFormXObjectID, 
	png_uint_32 transformed_width, 
	png_uint_32 transformed_height, 
	DocumentContext* inDocumentContext) {
	PDFFormXObject* formXObject = NULL;
	do
	{

		formXObject = inDocumentContext->StartFormXObject(PDFRectangle(0, 0, transformed_width, transformed_height), inFormXObjectID);
		if(!formXObject) {
			TRACE_LOG("PNGImageHandler::CreateImageFormXObjectFromImageXObject. Unexpected Error, could not start form XObject for image");
			break;
		}
		XObjectContentContext* xobjectContentContext = formXObject->GetContentContext();

		// iterate the images in the list and place one on top of each other
		PDFImageXObjectList::const_iterator it = inImageXObject.begin();
		for (; it != inImageXObject.end(); ++it) {
			xobjectContentContext->q();
			xobjectContentContext->cm(transformed_width, 0, 0, transformed_height, 0, 0);
			xobjectContentContext->Do(formXObject->GetResourcesDictionary().AddImageXObjectMapping(*it));
			xobjectContentContext->Q();
		}

		EStatusCode status = inDocumentContext->EndFormXObjectNoRelease(formXObject);
		if (status != PDFHummus::eSuccess)
		{
			TRACE_LOG("PNGImageHandler::CreateImageFormXObjectFromImageXObject. Unexpected Error, could not create form XObject for image");
			delete formXObject;
			formXObject = NULL;
			break;
		}


	} while (false);
	return formXObject;
}